

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EnsureYield(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  bool bVar1;
  uint32 uVar2;
  EmitInfo dst;
  WasmConstLitNode cnst;
  PolymorphicEmitInfo PVar3;
  uint local_2c;
  uint32 i;
  BlockInfo *blockInfo_local;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo yieldEmitInfo;
  
  PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)&this_local);
  bVar1 = BlockInfo::HasYield(blockInfo);
  if (bVar1) {
    this_local = *(WasmBytecodeGenerator **)&blockInfo->yieldInfo;
    yieldEmitInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    bVar1 = BlockInfo::DidYield(blockInfo);
    if (!bVar1) {
      blockInfo->didYield = true;
      for (local_2c = 0; uVar2 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local),
          local_2c < uVar2; local_2c = local_2c + 1) {
        dst = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&this_local,local_2c);
        cnst = GetZeroCnst(this);
        EmitLoadConst(this,dst,cnst);
      }
    }
  }
  PVar3._0_8_ = (ulong)this_local & 0xffffffff;
  PVar3.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldEmitInfo._0_8_;
  return PVar3;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EnsureYield(BlockInfo* blockInfo)
{
    PolymorphicEmitInfo yieldEmitInfo;
    if (blockInfo->HasYield())
    {
        yieldEmitInfo = blockInfo->yieldInfo;
        if (!blockInfo->DidYield())
        {
            // Emit a load to the yield location to make sure we have a dest there
            // Most likely we can't reach this code so the value doesn't matter
            blockInfo->didYield = true;
            for (uint32 i = 0; i < yieldEmitInfo.Count(); ++i)
            {
                EmitLoadConst(yieldEmitInfo.GetInfo(i), GetZeroCnst());
            }
        }
    }
    return yieldEmitInfo;
}